

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

void add_stone_to_deploy_msg
               (EVdfg_configuration config,EVdfg_deploy_msg *msg,EVdfg_stone_state dstone)

{
  void *pvVar1;
  undefined4 *size;
  undefined8 uVar2;
  long in_RDX;
  long in_RSI;
  int k;
  deploy_msg_stone mstone;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar3;
  void *in_stack_ffffffffffffffe0;
  
  pvVar1 = INT_CMrealloc(in_stack_ffffffffffffffe0,
                         CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  *(void **)(in_RSI + 0x10) = pvVar1;
  memset((void *)(*(long *)(in_RSI + 0x10) + (long)*(int *)(in_RSI + 8) * 0x40),0,0x40);
  size = (undefined4 *)(*(long *)(in_RSI + 0x10) + (long)*(int *)(in_RSI + 8) * 0x40);
  *size = *(undefined4 *)(in_RDX + 8);
  *(undefined8 *)(size + 2) = 0;
  if (*(long *)(in_RDX + 0x10) != 0) {
    uVar2 = attr_list_to_string(*(undefined8 *)(in_RDX + 0x10));
    *(undefined8 *)(size + 2) = uVar2;
  }
  size[4] = *(undefined4 *)(in_RDX + 0x18);
  size[5] = *(undefined4 *)(in_RDX + 0x1c);
  if (*(int *)(in_RDX + 4) == 0) {
    size[6] = *(undefined4 *)(in_RDX + 0x20);
    pvVar1 = INT_CMmalloc((size_t)size);
    *(void **)(size + 8) = pvVar1;
    for (iVar3 = 0; iVar3 < *(int *)(in_RDX + 0x20); iVar3 = iVar3 + 1) {
      if (*(int *)(*(long *)(in_RDX + 0x28) + (long)iVar3 * 4) == -1) {
        *(undefined4 *)(*(long *)(size + 8) + (long)iVar3 * 4) = 0xffffffff;
      }
      else {
        *(undefined4 *)(*(long *)(size + 8) + (long)iVar3 * 4) =
             *(undefined4 *)(*(long *)(in_RDX + 0x28) + (long)iVar3 * 4);
      }
    }
  }
  else {
    size[6] = 0;
    *(undefined8 *)(size + 8) = 0;
  }
  *(undefined8 *)(size + 10) = *(undefined8 *)(in_RDX + 0x48);
  if (*(int *)(in_RDX + 0x40) < 2) {
    size[0xc] = 0;
    *(undefined8 *)(size + 0xe) = 0;
  }
  else {
    size[0xc] = *(int *)(in_RDX + 0x40) + -1;
    pvVar1 = INT_CMmalloc((size_t)size);
    *(void **)(size + 0xe) = pvVar1;
    for (iVar3 = 0; iVar3 < (int)size[0xc]; iVar3 = iVar3 + 1) {
      *(undefined8 *)(*(long *)(size + 0xe) + (long)iVar3 * 8) =
           *(undefined8 *)(*(long *)(in_RDX + 0x50) + (long)iVar3 * 8);
    }
  }
  *(int *)(in_RSI + 8) = *(int *)(in_RSI + 8) + 1;
  return;
}

Assistant:

static void
add_stone_to_deploy_msg(EVdfg_configuration config, EVdfg_deploy_msg *msg, EVdfg_stone_state dstone) 	    
{
    deploy_msg_stone mstone;
    int k;
    msg->stone_list = realloc(msg->stone_list, (msg->stone_count +1) * sizeof(msg->stone_list[0]));
    memset(&msg->stone_list[msg->stone_count], 0, sizeof(msg->stone_list[0]));
    mstone = &msg->stone_list[msg->stone_count];
    mstone->global_stone_id = dstone->stone_id;
    mstone->attrs = NULL;
    if (dstone->attrs != NULL) {
	mstone->attrs = attr_list_to_string(dstone->attrs);
    }
    mstone->period_secs = dstone->period_secs;
    mstone->period_usecs = dstone->period_usecs;
    if (dstone->bridge_stone) {
	/* bridge stone virtual links should not be deployed, just for bookkeeping */
	mstone->out_count = 0;
	mstone->out_links = NULL;
    } else {
	mstone->out_count = dstone->out_count;
	mstone->out_links = malloc(sizeof(mstone->out_links[0])*mstone->out_count);
	for (k=0; k< dstone->out_count; k++) {
	    if (dstone->out_links[k] != -1) {
		mstone->out_links[k] = dstone->out_links[k];
	    } else {
		mstone->out_links[k] = -1;
	    }
	}
    }
    mstone->action = dstone->action;
    if (dstone->action_count > 1) {
	mstone->extra_actions = dstone->action_count - 1;
	mstone->xactions = malloc(sizeof(mstone->xactions[0])*mstone->extra_actions);
	for (k=0; k < mstone->extra_actions; k++) {
	    mstone->xactions[k] = dstone->extra_actions[k];
	}
    } else {
	mstone->extra_actions = 0;
	mstone->xactions = NULL;
    }
    msg->stone_count++;
}